

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

void __thiscall Problem_CGBG_FF::AssignAgentTypesToHouses(Problem_CGBG_FF *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  value_type_conflict1 *__x;
  value_type_conflict1 *pvVar4;
  reference pvVar5;
  Scope *pSVar6;
  reference this_00;
  size_type sVar7;
  const_reference pvVar8;
  reference this_01;
  pointer puVar9;
  void *this_02;
  BayesianGameBase *in_RDI;
  __type _Var10;
  undefined8 extraout_XMM0_Qb;
  size_t nrTypes;
  Index hI;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *houses_agI;
  Index agI;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  Scope *in_stack_ffffffffffffffc0;
  Index agI_00;
  uint local_1c;
  uint local_c;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           ">>Assigning observation houses to agents --- only allowing \'action houses\' <<"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_c = 0;
  while( true ) {
    __x = (value_type_conflict1 *)(ulong)local_c;
    pvVar4 = (value_type_conflict1 *)
             (**(code **)((((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &in_RDI->super_Interface_ProblemToPolicyDiscretePure)->_M_impl).
                          super__Vector_impl_data._M_start + 6))();
    if (pvVar4 <= __x) break;
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    local_1c = 0;
    while( true ) {
      in_stack_ffffffffffffffc0 = (Scope *)(ulong)local_1c;
      pSVar6 = (Scope *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
      if (pSVar6 <= in_stack_ffffffffffffffc0) break;
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      if (sVar7 == in_RDI[1]._m_nrAgents) {
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
        local_1c = (uint)sVar7;
      }
      else {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (&in_stack_ffffffffffffffc0->super_SDT,
                            (size_type)in_stack_ffffffffffffffb8);
        uVar1 = *pvVar8;
        this_01 = std::vector<Scope,_std::allocator<Scope>_>::at
                            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffffc0,
                             (size_type)in_stack_ffffffffffffffb8);
        puVar9 = (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    (&this_01->super_SDT);
        if (puVar9 < in_RDI[1]._m_nrActions.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
          std::vector<Scope,_std::allocator<Scope>_>::at
                    ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffffc0,
                     (size_type)in_stack_ffffffffffffffb8);
          Scope::Insert(in_stack_ffffffffffffffc0,(Index)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
          ;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__x);
          poVar3 = std::operator<<((ostream *)&std::cout,"Assigning house ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
          poVar3 = std::operator<<(poVar3," to agent ");
          this_02 = (void *)std::ostream::operator<<(poVar3,local_c);
          std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"House  ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
          std::operator<<(poVar3,
                          " is at full \'capacity\' (it has k agents in its scope), removing it from further consideration\n"
                         );
        }
      }
      local_1c = local_1c + 1;
    }
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    agI_00 = (Index)((ulong)__x >> 0x20);
    sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
    if (sVar7 < in_RDI[1]._m_nrAgents) {
      in_stack_ffffffffffffffb8 = in_RDI[1]._m_jointToIndTypesMap;
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
      _Var10 = std::pow<unsigned_long,unsigned_long>
                         ((unsigned_long)in_stack_ffffffffffffffc0,
                          (unsigned_long)in_stack_ffffffffffffffb8);
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar2._0_8_ = _Var10;
      vcvttsd2usi_avx512f(auVar2);
      BayesianGameBase::ChangeNrTypes(in_RDI,agI_00,(size_t)in_stack_ffffffffffffffc0);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Problem_CGBG_FF::AssignAgentTypesToHouses()
{
#define TYPES_INDEP_OF_ACTIONS 0 
#if TYPES_INDEP_OF_ACTIONS     
#if DEBUGASSIGN
    cout << ">>Assigning observation houses to agents --- independent of actions <<"<<endl;
#endif
    set<Index> availableHouses;
    for(Index hI=0; hI < _m_nrHouses; hI++)
        availableHouses.insert(hI);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        FixedCapacityPriorityQueue< diPair, diPairComp > pq( _m_nrObservedHousesPerAgents );
        for(set<Index>::iterator it=availableHouses.begin(); 
                it != availableHouses.end(); it++)            
        {
            Index hI = *it;
            double d = ComputeDistanceAgentToHouse(agI, hI);
            diPair p(d, hI);
            diPair overflown;
            pq.insert( p, overflown );
        }
        while(! pq.empty())
        {
            diPair p = pq.top();
            Index hI = p.second;
#if DEBUGASSIGN
            double d = p.first;
            cout << "Assigning house "<<hI<<" to agent " << agI <<
                " it has distance " << d << endl;
#endif
            _m_agentsForHouse_obs.at(hI).Insert(agI);
            _m_houseIndices_obs.at(agI).push_back(hI);
            if( _m_agentsForHouse_obs.at(hI).size() == _m_maxNrAgentsObservingAHouse )
            {
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
                availableHouses.erase(hI);
            }
            pq.pop();
        }
        //check how many observer house the agent actually got (could be less than _m_nrObservedHousesPerAgents!)
        if (_m_houseIndices_obs.at(agI).size() <  _m_nrObservedHousesPerAgents)
        {
            size_t nrTypes =  pow(_m_nrObsPerHouse, _m_houseIndices_obs.at(agI).size());
            ChangeNrTypes(agI, nrTypes);
        }
    }
#else // if not TYPES_INDEP_OF_ACTIONS     
#if DEBUGASSIGN
    cout << ">>Assigning observation houses to agents --- only allowing 'action houses' <<"<<endl;
#endif
    //set<Index> availableHouses;
    //for(Index hI=0; hI < _m_nrHouses; hI++)
        //availableHouses.insert(hI);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        const std::vector<Index> & houses_agI = _m_houseIndices_action.at(agI);
        for(Index i = 0; i < houses_agI.size(); i++)
        {
            if (_m_houseIndices_obs.at(agI).size() == _m_nrObservedHousesPerAgents)     
            {
                //agent has reached the maximum number of house, no point in looping to remaining houses
                i =  houses_agI.size();
                continue;
            }

            Index hI = houses_agI.at(i); //<-the candidate house index
            //assign this house if it is not at capacity yet
            if  (_m_agentsForHouse_obs.at(hI).size() < _m_maxNrAgentsObservingAHouse)   //this house is not at full capacity?
            {
                _m_agentsForHouse_obs.at(hI).Insert(agI);
                _m_houseIndices_obs.at(agI).push_back(hI);
#if DEBUGASSIGN
                cout << "Assigning house "<<hI<<" to agent " << agI << endl;
#endif            
            }
            else
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
            }

/*        
        FixedCapacityPriorityQueue< diPair, diPairComp > pq( _m_nrObservedHousesPerAgents );
        for(set<Index>::iterator it=availableHouses.begin(); 
                it != availableHouses.end(); it++)            
        {
            Index hI = *it;
            double d = ComputeDistanceAgentToHouse(agI, hI);
            diPair p(d, hI);
            diPair overflown;
            pq.insert( p, overflown );
        }
        while(! pq.empty())
        {
            diPair p = pq.top();
            Index hI = p.second;
#if DEBUGASSIGN
            double d = p.first;
            cout << "Assigning house "<<hI<<" to agent " << agI <<
                " it has distance " << d << endl;
#endif
            _m_agentsForHouse_obs.at(hI).Insert(agI);
            _m_houseIndices_obs.at(agI).push_back(hI);
            if( _m_agentsForHouse_obs.at(hI).size() == _m_maxNrAgentsObservingAHouse )
            {
#if DEBUGASSIGN
                cout << "House  "<<hI<<" is at full 'capacity' (it has k agents in its scope), removing it from further consideration\n";
#endif
                availableHouses.erase(hI);
            }
            pq.pop();
        }
*/        
        //check how many observed houses the agent actually got (could be less than _m_nrObservedHousesPerAgents!)
        if (_m_houseIndices_obs.at(agI).size() <  _m_nrObservedHousesPerAgents)
        {
            size_t nrTypes =  pow(_m_nrObsPerHouse, _m_houseIndices_obs.at(agI).size());
            ChangeNrTypes(agI, nrTypes);
        }
    }
#endif // ends if TYPES_INDEP_OF_ACTIONS     
}